

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O1

int pushline(lua_State *L,int firstline)

{
  size_t len;
  char *b;
  char *pcVar1;
  int iVar2;
  char *__s;
  char buffer [512];
  undefined8 uStack_230;
  char local_228;
  undefined1 local_227 [511];
  
  pcVar1 = "_PROMPT";
  if (firstline == 0) {
    pcVar1 = "_PROMPT2";
  }
  __s = "> ";
  if (firstline == 0) {
    __s = ">> ";
  }
  uStack_230 = 0x109672;
  lua_getglobal(L,pcVar1);
  iVar2 = 0;
  uStack_230 = 0x109684;
  pcVar1 = lua_tolstring(L,-1,(size_t *)0x0);
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  uStack_230 = 0x10969e;
  fputs(__s,_stdout);
  uStack_230 = 0x1096a7;
  fflush(_stdout);
  uStack_230 = 0x1096be;
  pcVar1 = fgets(&local_228,0x200,_stdin);
  if (pcVar1 != (char *)0x0) {
    uStack_230 = 0x1096d0;
    lua_settop(L,-2);
    uStack_230 = 0x1096d8;
    len = strlen(&local_228);
    if (len == 0) {
      len = 0;
    }
    else if (*(char *)((long)&uStack_230 + len + 7) == '\n') {
      *(undefined1 *)((long)&uStack_230 + len + 7) = 0;
      len = len - 1;
    }
    if ((firstline == 0) || (local_228 != '=')) {
      uStack_230 = 0x109720;
      lua_pushlstring(L,&local_228,len);
    }
    else {
      uStack_230 = 0x109710;
      lua_pushfstring(L,"return %s",local_227);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int pushline (lua_State *L, int firstline) {
  char buffer[LUA_MAXINPUT];
  char *b = buffer;
  size_t l;
  const char *prmt = get_prompt(L, firstline);
  int readstatus = lua_readline(L, b, prmt);
  if (readstatus == 0)
    return 0;  /* no input (prompt will be popped by caller) */
  lua_pop(L, 1);  /* remove prompt */
  l = strlen(b);
  if (l > 0 && b[l-1] == '\n')  /* line ends with newline? */
    b[--l] = '\0';  /* remove it */
  if (firstline && b[0] == '=')  /* for compatibility with 5.2, ... */
    lua_pushfstring(L, "return %s", b + 1);  /* change '=' to 'return' */
  else
    lua_pushlstring(L, b, l);
  lua_freeline(L, b);
  return 1;
}